

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.h
# Opt level: O0

path * __thiscall mp::path::filename(path *this)

{
  ulong in_RSI;
  path *in_RDI;
  size_t last_sep;
  string *in_stack_ffffffffffffff88;
  path *in_stack_ffffffffffffff90;
  path *this_00;
  path local_38;
  size_t local_18;
  
  local_18 = FindLastSep(in_stack_ffffffffffffff90);
  if (local_18 == 0xffffffffffffffff) {
    path(in_stack_ffffffffffffff90,(path *)in_stack_ffffffffffffff88);
  }
  else {
    this_00 = &local_38;
    std::__cxx11::string::substr((ulong)this_00,in_RSI);
    path(this_00,in_stack_ffffffffffffff88);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return in_RDI;
}

Assistant:

path filename() const {
    size_t last_sep = FindLastSep();
    return last_sep == std::string::npos ?
        *this : path(str_.substr(last_sep + 1));
  }